

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::Player(Player *this,string *role)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Ship *local_98;
  undefined1 local_90 [100];
  int local_2c;
  int local_28;
  int j;
  int i;
  string *local_18;
  string *role_local;
  Player *this_local;
  
  local_18 = role;
  role_local = &this->name;
  std::__cxx11::string::string((string *)this);
  local_98 = (Ship *)&this->field_0x264;
  do {
    Ship::Ship(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != (Ship *)&this->field_0x3a4);
  for (local_28 = 1; local_28 < 0xb; local_28 = local_28 + 1) {
    for (local_2c = 1; local_2c < 0xb; local_2c = local_2c + 1) {
      this->playerArea[local_28][local_2c] = 100;
      this->enemyArea[local_28][local_2c] = 0;
    }
  }
  bVar1 = std::operator==(role,"human");
  setRole(this,bVar1);
  iVar2 = rand();
  std::__cxx11::to_string((__cxx11 *)(local_90 + 0x20),iVar2 + 1 + (iVar2 / 99) * -99);
  std::operator+(local_90 + 0x40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Player_");
  setName(this,(string *)(local_90 + 0x40));
  std::__cxx11::string::~string((string *)(local_90 + 0x40));
  std::__cxx11::string::~string((string *)(local_90 + 0x20));
  initShips(this);
  bVar1 = getRole(this);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Human");
  }
  else {
    std::operator<<((ostream *)&std::cout,"AI");
  }
  poVar3 = std::operator<<((ostream *)&std::cout," is being created as ");
  getName_abi_cxx11_((Player *)local_90);
  poVar3 = std::operator<<(poVar3,(string *)local_90);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

Player::Player(std::string role) {
    for(int i = 1; i <= 10; i++)
        for(int j = 1; j <= 10; j++)
        {
            playerArea[i][j] = Player::FREE_CODE;
            enemyArea[i][j] = Player::UNKNOWN_CODE;
        }
    setRole(role == "human"); //TRUE if human, else FALSE
    setName("Player_" + std::to_string(rand() % 99 + 1)); //name as Player_NN
    initShips();

    //log
    getRole() ? std::cout << "Human" : std::cout << "AI";
    std::cout << " is being created as " << getName() << std::endl;


}